

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

void __thiscall psy::C::Lexer::lex(Lexer *this)

{
  uint uVar1;
  SyntaxTree *pSVar2;
  uint32_t offset;
  bool bVar3;
  byte bVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  StringLiteral *pSVar8;
  ulong uVar9;
  size_type sVar10;
  _Elt_pointer puVar11;
  SyntaxToken *pSVar12;
  byte bVar13;
  SyntaxKind SVar14;
  undefined1 uVar15;
  long lVar16;
  pointer ppVar17;
  allocator<char> local_179;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  expansions;
  ulong local_158;
  SyntaxToken local_150;
  SyntaxToken local_118;
  stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> braces;
  string local_88;
  SyntaxToken local_68;
  
  pSVar2 = this->tree_;
  SyntaxToken::SyntaxToken(&local_68,(SyntaxTree *)0x0);
  SyntaxTree::addToken(pSVar2,&local_68);
  SyntaxToken::~SyntaxToken(&local_68);
  pSVar2 = this->tree_;
  SyntaxTree::filePath_abi_cxx11_((string *)&braces,pSVar2);
  SyntaxTree::relayLineDirective(pSVar2,0,1,(string *)&braces);
  std::__cxx11::string::~string((string *)&braces);
  SyntaxTree::relayLineStart(this->tree_,0);
  expansions.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  expansions.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  expansions.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::stack<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>>::
  stack<std::deque<unsigned_int,std::allocator<unsigned_int>>,void>(&braces);
  SyntaxToken::SyntaxToken(&local_150,this->tree_);
  local_158 = 0;
  do {
    yylex(this,&local_150);
    while ((offset = local_150.charOffset_, (local_150.field_7.BF_all_._0_1_ & 1) != 0 &&
           (local_150.syntaxK_ == HashToken))) {
      yylex(this,&local_150);
      uVar15 = local_150.field_7.BF_all_._0_1_;
      SVar14 = local_150.syntaxK_;
      if (local_150.syntaxK_ == IdentifierToken && (local_150.field_7.BF_all_._0_1_ & 1) == 0) {
        pcVar6 = *(char **)&((local_150.field_10.identifier_)->super_Lexeme).field_0x10;
        iVar5 = strcmp(pcVar6,"expansion");
        if (iVar5 != 0) {
          iVar5 = strcmp(pcVar6,"line");
          SVar14 = IdentifierToken;
          if (iVar5 == 0) {
            yylex(this,&local_150);
            uVar15 = local_150.field_7.BF_all_._0_1_;
            SVar14 = local_150.syntaxK_;
          }
          goto LAB_002e289a;
        }
        yylex(this,&local_150);
        if (((local_150.field_7.BF_all_._0_1_ & 1) == 0) && (local_150.syntaxK_ == IdentifierToken))
        {
          pcVar6 = *(char **)&((local_150.field_10.identifier_)->super_Lexeme).field_0x10;
          iVar5 = strcmp(pcVar6,"begin");
          if (iVar5 == 0) {
            yylex(this,&local_150);
            yylex(this,&local_150);
            yylex(this,&local_150);
            yylex(this,&local_150);
            while ((local_150.syntaxK_ != EndOfFile && ((local_150.field_7.BF_all_._0_1_ & 1) == 0))
                  ) {
              if (local_150.syntaxK_ == IntegerConstantToken) {
                pcVar6 = SyntaxToken::valueText_c_str(&local_150);
                uVar7 = strtoul(pcVar6,(char **)0x0,0);
                yylex(this,&local_150);
                yylex(this,&local_150);
                pcVar6 = SyntaxToken::valueText_c_str(&local_150);
                uVar9 = strtoul(pcVar6,(char **)0x0,0);
                yylex(this,&local_150);
                local_88._M_dataplus._M_p._0_4_ = (undefined4)uVar7;
                local_88._M_dataplus._M_p._4_4_ = (undefined4)uVar9;
                std::
                vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                ::emplace_back<std::pair<unsigned_int,unsigned_int>>
                          ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                            *)&expansions,(pair<unsigned_int,_unsigned_int> *)&local_88);
              }
              else if (local_150.syntaxK_ == OperatorName_COMPLToken) {
                yylex(this,&local_150);
                pcVar6 = SyntaxToken::valueText_c_str(&local_150);
                uVar7 = strtoul(pcVar6,(char **)0x0,0);
                lVar16 = (long)expansions.
                               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)expansions.
                               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                std::
                vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ::resize(&expansions,(lVar16 >> 3) + uVar7);
                for (ppVar17 = (pointer)(lVar16 + (long)expansions.
                                                                                                                
                                                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                    ppVar17 !=
                    expansions.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; ppVar17 = ppVar17 + 1) {
                  ppVar17->first = 0;
                  ppVar17->second = 0;
                }
                yylex(this,&local_150);
              }
            }
          }
          else {
            iVar5 = strcmp(pcVar6,"end");
            if (iVar5 == 0) {
              if (expansions.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  expansions.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                expansions.
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     expansions.
                     super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
              }
              local_158 = 0;
              yylex(this,&local_150);
            }
          }
        }
      }
      else {
LAB_002e289a:
        if (((uVar15 & 1) == 0) && (SVar14 == IntegerConstantToken)) {
          pcVar6 = SyntaxToken::valueText_c_str(&local_150);
          uVar7 = strtoul(pcVar6,(char **)0x0,0);
          yylex(this,&local_150);
          if (((local_150.field_7.BF_all_._0_1_ & 1) == 0) &&
             (local_150.syntaxK_ == StringLiteralToken)) {
            pSVar8 = SyntaxTree::findOrInsertStringLiteral
                               (this->tree_,
                                *(char **)&((local_150.field_10.identifier_)->super_Lexeme).
                                           field_0x10,
                                *(uint *)&((local_150.field_10.identifier_)->super_Lexeme).field_0x8
                               );
            pSVar2 = this->tree_;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_88,*(char **)&(pSVar8->super_Lexeme).field_0x10,&local_179);
            SyntaxTree::relayLineDirective(pSVar2,offset,(uint)uVar7,&local_88);
            std::__cxx11::string::~string((string *)&local_88);
            yylex(this,&local_150);
          }
        }
        while (((local_150.field_7.BF_all_._0_1_ & 1) == 0 && (local_150.syntaxK_ != EndOfFile))) {
          yylex(this,&local_150);
        }
      }
    }
    if (local_150.syntaxK_ == CloseBraceToken) {
      if (braces.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur ==
          braces.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur) goto LAB_002e2ba4;
      puVar11 = braces.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur;
      if (braces.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur ==
          braces.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        puVar11 = braces.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
      }
      uVar1 = puVar11[-1];
      std::deque<unsigned_int,_std::allocator<unsigned_int>_>::pop_back(&braces.c);
      sVar10 = SyntaxTree::tokenCount(this->tree_);
      if (uVar1 < sVar10) {
        sVar10 = SyntaxTree::tokenCount(this->tree_);
        pSVar12 = SyntaxTree::tokenAt(this->tree_,(ulong)uVar1);
        pSVar12->matchingBracket_ = sVar10;
      }
LAB_002e2bce:
      if ((expansions.
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           expansions.
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) ||
         ((ulong)((long)expansions.
                        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)expansions.
                        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) <= local_158)) {
        bVar4 = 0;
        bVar13 = 0;
      }
      else {
        if (expansions.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start[local_158].first == 0) {
          bVar13 = 0x10;
        }
        else {
          SyntaxTree::relayExpansion
                    (this->tree_,local_150.charOffset_,
                     expansions.
                     super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_158]);
          bVar13 = 0;
        }
        local_158 = (ulong)((int)local_158 + 1);
        bVar4 = 8;
      }
      local_150.field_7.BF_all_._0_1_ = local_150.field_7.BF_all_._0_1_ & 0xe7 | bVar4 | bVar13;
      local_118.field_10 = local_150.field_10;
      local_118._33_8_ = local_150._33_8_;
      local_118._41_4_ = local_150._41_4_;
      local_118._45_2_ = local_150._45_2_;
      local_118._47_1_ = local_150._47_1_;
      local_118.matchingBracket_ = local_150.matchingBracket_;
      local_118.tree_ = local_150.tree_;
      local_118.field_7.BF_all_._0_1_ = local_150.field_7.BF_all_._0_1_;
      SyntaxTree::addToken(this->tree_,&local_118);
      SyntaxToken::~SyntaxToken(&local_118);
    }
    else {
      if (local_150.syntaxK_ == OpenBraceToken) {
        sVar10 = SyntaxTree::tokenCount(this->tree_);
        local_88._M_dataplus._M_p._0_4_ = (undefined4)sVar10;
        std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&braces.c,(uint *)&local_88);
        goto LAB_002e2bce;
      }
LAB_002e2ba4:
      bVar3 = SyntaxToken::isComment(&local_150);
      if (!bVar3) goto LAB_002e2bce;
      std::vector<psy::C::SyntaxToken,_std::allocator<psy::C::SyntaxToken>_>::push_back
                (&this->tree_->comments_,&local_150);
      if (local_150.syntaxK_ == Keyword_ExtPSY_omission) goto LAB_002e2bce;
    }
    if (local_150.syntaxK_ == EndOfFile) {
      while (braces.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur !=
             braces.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur) {
        puVar11 = braces.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur;
        if (braces.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur ==
            braces.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Deque_impl_data._M_finish._M_first) {
          puVar11 = braces.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
        }
        uVar1 = puVar11[-1];
        sVar10 = SyntaxTree::tokenCount(this->tree_);
        pSVar12 = SyntaxTree::tokenAt(this->tree_,(ulong)uVar1);
        pSVar12->matchingBracket_ = sVar10;
        std::deque<unsigned_int,_std::allocator<unsigned_int>_>::pop_back(&braces.c);
      }
      SyntaxToken::~SyntaxToken(&local_150);
      std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base
                ((_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *)&braces);
      std::
      _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::~_Vector_base(&expansions.
                       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     );
      return;
    }
  } while( true );
}

Assistant:

void Lexer::lex()
{
    // Marker (invalid) token.
    tree_->addToken(SyntaxToken(nullptr));

    // Line and column...
    tree_->relayLineDirective(0, 1, tree_->filePath());
    tree_->relayLineStart(0);
    std::vector<std::pair<unsigned int, unsigned int>> expansions;
    unsigned int curExpansionIdx = 0;

    // SyntaxKind::Open/close brace tracking.
    std::stack<unsigned> braces;

    SyntaxToken tk(tree_);

    do {
        yylex(&tk);

LexEntry:
        if (tk.isAtStartOfLine() && tk.isKind(SyntaxKind::HashToken)) {
            auto offset = tk.charOffset_;
            yylex(&tk);

            if (!tk.isAtStartOfLine()
                    && tk.isKind(SyntaxKind::IdentifierToken)
                    && !strcmp(tk.identifier_->c_str(), kExpansion)) {
                // A Qt Creator-specific macro mark.
                yylex(&tk);

                if (!tk.isAtStartOfLine() && tk.isKind(SyntaxKind::IdentifierToken)) {
                    if (!strcmp(tk.identifier_->c_str(), kBegin)) {
                        // The start of an expansion section.
                        yylex(&tk);

                        // Gather where it happens and its length.
                        yylex(&tk);
                        yylex(&tk); // Skip the separating comma.
                        yylex(&tk);

                        // Gather the real line and column from the upcoming tokens; only
                        // relevant for tokens which are expanded but not generated.
                        while (!tk.isKind(SyntaxKind::EndOfFile)
                                    && !tk.isAtStartOfLine()) {
                            // A ~ means that the a number of generated tokens follows;
                            // otherwise, what follows is data.
                            if (tk.isKind(SyntaxKind::TildeToken)) {
                                yylex(&tk);

                                // Get the total number of generated tokens and specify "null"
                                // information for them.
                                auto all = strtoul(tk.valueText_c_str(), 0, 0);
                                auto prevSize = expansions.size();
                                expansions.resize(prevSize + all);
                                std::fill(expansions.begin() + prevSize,
                                          expansions.end(),
                                          std::make_pair(0, 0));

                                yylex(&tk);
                            }
                            else if (tk.isKind(SyntaxKind::IntegerConstantToken)) {
                                auto lineno = strtoul(tk.valueText_c_str(), 0, 0);
                                yylex(&tk);
                                yylex(&tk); // Skip the separating colon.
                                auto column = strtoul(tk.valueText_c_str(), 0, 0);
                                yylex(&tk);

                                // Store line and column for this non-generated token.
                                expansions.push_back(std::make_pair(lineno, column));
                            }
                        }
                    }
                    else if (!strcmp(tk.identifier_->c_str(), kEnd)) {
                        // The end of an expansion section.
                        expansions.clear();
                        curExpansionIdx = 0;
                        yylex(&tk);
                    }
                }
            }
            else {
                // A regular preprocessor directive.
                if (!tk.isAtStartOfLine()
                        && tk.isKind(SyntaxKind::IdentifierToken)
                        && !strcmp(tk.identifier_->c_str(), kLine)) {
                    yylex(&tk);
                }

                if (!tk.isAtStartOfLine()
                        && tk.isKind(SyntaxKind::IntegerConstantToken)) {
                    auto lineno = strtoul(tk.valueText_c_str(), 0, 0);
                    yylex(&tk);

                    if (!tk.isAtStartOfLine()
                            && tk.isKind(SyntaxKind::StringLiteralToken)) {
                        auto fileName = tree_->findOrInsertStringLiteral(tk.string_->c_str(), tk.string_->size());
                        tree_->relayLineDirective(offset, lineno, fileName->c_str());
                        yylex(&tk);
                    }
                }

                while (!tk.isAtStartOfLine() && !tk.isKind(SyntaxKind::EndOfFile)) {
                    // Skip the remaining of the line, ignoring a possible include.
                    yylex(&tk);
                }
            }
            goto LexEntry;
        }
        else if (tk.kind() == SyntaxKind::OpenBraceToken) {
            braces.push(tree_->tokenCount());
        }
        else if (tk.kind() == SyntaxKind::CloseBraceToken && !braces.empty()) {
            auto idx = braces.top();
            braces.pop();
            if (idx < tree_->tokenCount())
                tree_->tokenAt(idx).matchingBracket_ = tree_->tokenCount();
        }
        else if (tk.isComment()) {
            tree_->comments_.push_back(tk);
            if (tk.kind() != SyntaxKind::Keyword_ExtPSY_omission)
                continue;
        }

        bool isExpanded = false;
        bool isGenerated = false;
        if (!expansions.empty() && curExpansionIdx < expansions.size()) {
            isExpanded = true;
            const std::pair<unsigned int, unsigned int>& p = expansions[curExpansionIdx];
            if (p.first)
                tree_->relayExpansion(tk.charStart(), p);
            else
                isGenerated = true;
            ++curExpansionIdx;
        }
        tk.BF_.expanded_ = isExpanded;
        tk.BF_.generated_ = isGenerated;

        tree_->addToken(tk);
    }
    while (tk.kind() != SyntaxKind::EndOfFile);

    for (; !braces.empty(); braces.pop()) {
        auto idx = braces.top();
        tree_->tokenAt(idx).matchingBracket_ = tree_->tokenCount();
    }
}